

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap_lock.c
# Opt level: O1

ALLEGRO_LOCKED_REGION * al_lock_bitmap_blocked(ALLEGRO_BITMAP *bitmap,int flags)

{
  int iVar1;
  int mul;
  int iVar2;
  int iVar3;
  ALLEGRO_LOCKED_REGION *pAVar4;
  
  iVar1 = al_get_bitmap_format(bitmap);
  mul = al_get_pixel_block_width(iVar1);
  iVar1 = al_get_pixel_block_height(iVar1);
  iVar2 = _al_get_least_multiple(bitmap->w,mul);
  iVar3 = _al_get_least_multiple(bitmap->h,iVar1);
  pAVar4 = al_lock_bitmap_region_blocked(bitmap,0,0,iVar2 / mul,iVar3 / iVar1,flags);
  return pAVar4;
}

Assistant:

ALLEGRO_LOCKED_REGION *al_lock_bitmap_blocked(ALLEGRO_BITMAP *bitmap,
   int flags)
{
   int bitmap_format = al_get_bitmap_format(bitmap);
   int block_width = al_get_pixel_block_width(bitmap_format);
   int block_height = al_get_pixel_block_height(bitmap_format);

   return al_lock_bitmap_region_blocked(bitmap, 0, 0,
      _al_get_least_multiple(bitmap->w, block_width) / block_width,
      _al_get_least_multiple(bitmap->h, block_height) / block_height,
      flags);
}